

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

UnicodeString * __thiscall icu_63::EquivIterator::next(EquivIterator *this)

{
  UBool UVar1;
  UnicodeString *_next;
  EquivIterator *this_local;
  
  this_local = (EquivIterator *)Hashtable::get(this->_hash,this->_current);
  if ((UnicodeString *)this_local == (UnicodeString *)0x0) {
    this_local = (EquivIterator *)0x0;
  }
  else {
    UVar1 = UnicodeString::operator==((UnicodeString *)this_local,this->_start);
    if (UVar1 == '\0') {
      this->_current = (UnicodeString *)this_local;
    }
    else {
      this_local = (EquivIterator *)0x0;
    }
  }
  return (UnicodeString *)this_local;
}

Assistant:

const icu::UnicodeString *
EquivIterator::next() {
    const icu::UnicodeString* _next = (const icu::UnicodeString*) _hash.get(*_current);
    if (_next == NULL) {
        U_ASSERT(_current == _start);
        return NULL;
    }
    if (*_next == *_start) {
        return NULL;
    }
    _current = _next;
    return _next;
}